

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::double_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,double_writer *f)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  size_t size;
  char *__s;
  char *__dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ulong uVar5;
  size_t __len_1;
  ulong __n;
  ptrdiff_t _Num;
  size_t __n_00;
  size_t __len;
  size_t sVar6;
  
  uVar4 = (ulong)spec->width_;
  uVar5 = (f->buffer->size_ + 1) - (ulong)(f->sign == '\0');
  plVar2 = *(long **)this;
  lVar3 = plVar2[1];
  sVar6 = uVar4 - uVar5;
  if (uVar4 < uVar5 || sVar6 == 0) {
    std::__cxx11::string::resize((ulong)plVar2,(char)uVar5 + (char)lVar3);
    __dest = (char *)(lVar3 + *plVar2);
LAB_0011cc0b:
    if (f->sign != '\0') {
      *__dest = f->sign;
      __dest = __dest + 1;
      f->n = f->n - 1;
    }
    sVar6 = f->buffer->size_;
    if (sVar6 == 0) {
      return;
    }
    memmove(__dest,f->buffer->ptr_,sVar6);
    return;
  }
  std::__cxx11::string::resize((ulong)plVar2,(char)lVar3 + (char)spec->width_);
  __s = (char *)(lVar3 + *plVar2);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    __n = sVar6 >> 1;
    if (1 < sVar6) {
      memset(__s,(uint)bVar1,__n);
      __s = __s + __n;
    }
    if (f->sign != '\0') {
      *__s = f->sign;
      __s = __s + 1;
      f->n = f->n - 1;
    }
    __n_00 = f->buffer->size_;
    if (__n_00 != 0) {
      memmove(__s,f->buffer->ptr_,__n_00);
    }
    if (uVar4 == uVar5) {
      return;
    }
    sVar6 = sVar6 - __n;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      __dest = __s;
      if (uVar4 != uVar5) {
        __dest = __s + sVar6;
        memset(__s,(uint)bVar1,sVar6);
      }
      goto LAB_0011cc0b;
    }
    if (f->sign != '\0') {
      *__s = f->sign;
      __s = __s + 1;
      f->n = f->n - 1;
    }
    __n_00 = f->buffer->size_;
    if (__n_00 != 0) {
      memmove(__s,f->buffer->ptr_,__n_00);
    }
    if (uVar4 == uVar5) {
      return;
    }
  }
  memset(__s + __n_00,(uint)bVar1,sVar6);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }